

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

void get_intra_q_and_bounds
               (AV1_COMP *cpi,int width,int height,int *active_best,int *active_worst,int cq_level)

{
  RATE_CONTROL *rc;
  byte bVar1;
  int iVar2;
  aom_bit_depth_t bit_depth;
  AV1_PRIMARY *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double qstart;
  
  pAVar3 = cpi->ppi;
  iVar2 = *active_worst;
  bit_depth = ((cpi->common).seq_params)->bit_depth;
  if ((1 < (cpi->rc).frames_to_key) || (iVar6 = cq_level, (cpi->oxcf).rc_cfg.mode != AOM_Q)) {
    rc = &cpi->rc;
    iVar6 = iVar2;
    if ((pAVar3->p_rc).this_key_frame_forced == 0) {
      iVar4 = get_kf_active_quality(&pAVar3->p_rc,iVar2,bit_depth);
      iVar2 = iVar4 / 2;
      if (cpi->is_screen_content_type == 0) {
        iVar2 = iVar4;
      }
      if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) {
        dVar7 = *(double *)(&DAT_00503d20 + (ulong)(height * width < 0x18c01) * 8);
      }
      else {
        iVar4 = (pAVar3->twopass).kf_zeromotion_pct;
        if (0x62 < iVar4) {
          iVar2 = iVar2 / 3;
        }
        dVar7 = (double)iVar4 * -0.001 + 0.05 +
                *(double *)(&DAT_00503d20 + (ulong)(height * width < 0x18c01) * 8);
      }
      qstart = av1_convert_qindex_to_q(iVar2,bit_depth);
      iVar4 = av1_compute_qdelta(rc,qstart,dVar7 * qstart,bit_depth);
      cq_level = iVar4 + iVar2;
      if (((cpi->oxcf).rc_cfg.mode == AOM_Q) && (cpi->superres_mode - AOM_SUPERRES_QTHRESH < 2)) {
        bVar1 = (cpi->common).superres_scale_denominator;
        if (bVar1 != 8) {
          cq_level = (cq_level - ((uint)bVar1 + (uint)bVar1)) + 0x10;
          if (cq_level < 1) {
            cq_level = 0;
          }
        }
      }
    }
    else {
      iVar4 = (pAVar3->p_rc).last_boosted_qindex;
      if (((cpi->oxcf).pass < AOM_RC_LAST_PASS) ||
         ((pAVar3->twopass).last_kfgroup_zeromotion_pct < 0x5f)) {
        dVar7 = av1_convert_qindex_to_q(iVar4,bit_depth);
        iVar5 = av1_compute_qdelta(rc,dVar7,dVar7 * 0.5,bit_depth);
        iVar2 = (cpi->rc).best_quality;
        cq_level = iVar5 + iVar4;
        if (iVar5 + iVar4 <= iVar2) {
          cq_level = iVar2;
        }
      }
      else {
        iVar6 = (pAVar3->p_rc).last_kf_qindex;
        cq_level = iVar4;
        if (iVar6 < iVar4) {
          cq_level = iVar6;
        }
        dVar7 = av1_convert_qindex_to_q(cq_level,bit_depth);
        iVar4 = av1_compute_qdelta(rc,dVar7,dVar7 * 1.25,bit_depth);
        iVar6 = iVar4 + cq_level;
        if (iVar2 <= iVar4 + cq_level) {
          iVar6 = iVar2;
        }
      }
    }
  }
  *active_best = cq_level;
  *active_worst = iVar6;
  return;
}

Assistant:

static void get_intra_q_and_bounds(const AV1_COMP *cpi, int width, int height,
                                   int *active_best, int *active_worst,
                                   int cq_level) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  int active_best_quality;
  int active_worst_quality = *active_worst;
  const int bit_depth = cm->seq_params->bit_depth;

  if (rc->frames_to_key <= 1 && oxcf->rc_cfg.mode == AOM_Q) {
    // If the next frame is also a key frame or the current frame is the
    // only frame in the sequence in AOM_Q mode, just use the cq_level
    // as q.
    active_best_quality = cq_level;
    active_worst_quality = cq_level;
  } else if (p_rc->this_key_frame_forced) {
    // Handle the special case for key frames forced when we have reached
    // the maximum key frame interval. Here force the Q to a range
    // based on the ambient Q to reduce the risk of popping.
    double last_boosted_q;
    int delta_qindex;
    int qindex;
#if CONFIG_FPMT_TEST
    const int simulate_parallel_frame =
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
        cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
    int last_boosted_qindex = simulate_parallel_frame
                                  ? p_rc->temp_last_boosted_qindex
                                  : p_rc->last_boosted_qindex;
#else
    int last_boosted_qindex = p_rc->last_boosted_qindex;
#endif
    if (is_stat_consumption_stage_twopass(cpi) &&
        cpi->ppi->twopass.last_kfgroup_zeromotion_pct >= STATIC_MOTION_THRESH) {
      qindex = AOMMIN(p_rc->last_kf_qindex, last_boosted_qindex);
      active_best_quality = qindex;
      last_boosted_q = av1_convert_qindex_to_q(qindex, bit_depth);
      delta_qindex = av1_compute_qdelta(rc, last_boosted_q,
                                        last_boosted_q * 1.25, bit_depth);
      active_worst_quality =
          AOMMIN(qindex + delta_qindex, active_worst_quality);
    } else {
      qindex = last_boosted_qindex;
      last_boosted_q = av1_convert_qindex_to_q(qindex, bit_depth);
      delta_qindex = av1_compute_qdelta(rc, last_boosted_q,
                                        last_boosted_q * 0.50, bit_depth);
      active_best_quality = AOMMAX(qindex + delta_qindex, rc->best_quality);
    }
  } else {
    // Not forced keyframe.
    double q_adj_factor = 1.0;
    double q_val;

    // Baseline value derived from active_worst_quality and kf boost.
    active_best_quality =
        get_kf_active_quality(p_rc, active_worst_quality, bit_depth);
    if (cpi->is_screen_content_type) {
      active_best_quality /= 2;
    }

    if (is_stat_consumption_stage_twopass(cpi) &&
        cpi->ppi->twopass.kf_zeromotion_pct >= STATIC_KF_GROUP_THRESH) {
      active_best_quality /= 3;
    }

    // Allow somewhat lower kf minq with small image formats.
    if ((width * height) <= (352 * 288)) {
      q_adj_factor -= 0.25;
    }

    // Make a further adjustment based on the kf zero motion measure.
    if (is_stat_consumption_stage_twopass(cpi))
      q_adj_factor +=
          0.05 - (0.001 * (double)cpi->ppi->twopass.kf_zeromotion_pct);

    // Convert the adjustment factor to a qindex delta
    // on active_best_quality.
    q_val = av1_convert_qindex_to_q(active_best_quality, bit_depth);
    active_best_quality +=
        av1_compute_qdelta(rc, q_val, q_val * q_adj_factor, bit_depth);

    // Tweak active_best_quality for AOM_Q mode when superres is on, as this
    // will be used directly as 'q' later.
    if (oxcf->rc_cfg.mode == AOM_Q &&
        (cpi->superres_mode == AOM_SUPERRES_QTHRESH ||
         cpi->superres_mode == AOM_SUPERRES_AUTO) &&
        cm->superres_scale_denominator != SCALE_NUMERATOR) {
      active_best_quality =
          AOMMAX(active_best_quality -
                     ((cm->superres_scale_denominator - SCALE_NUMERATOR) *
                      SUPERRES_QADJ_PER_DENOM_KEYFRAME),
                 0);
    }
  }
  *active_best = active_best_quality;
  *active_worst = active_worst_quality;
}